

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void aom_dc_top_predictor_32x64_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  uint8_t *in_RSI;
  undefined8 in_XMM0_Qa;
  __m256i row;
  __m256i zero;
  __m256i sixteen;
  __m256i sum;
  undefined8 uStack_d8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  dc_sum_32(in_RSI);
  auVar1 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar1 = vpinsrw_avx(auVar1,0x10,2);
  auVar1 = vpinsrw_avx(auVar1,0x10,3);
  auVar1 = vpinsrw_avx(auVar1,0x10,4);
  auVar1 = vpinsrw_avx(auVar1,0x10,5);
  auVar1 = vpinsrw_avx(auVar1,0x10,6);
  auVar1 = vpinsrw_avx(auVar1,0x10,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar2 = vpinsrw_avx(auVar2,0x10,2);
  auVar2 = vpinsrw_avx(auVar2,0x10,3);
  auVar2 = vpinsrw_avx(auVar2,0x10,4);
  auVar2 = vpinsrw_avx(auVar2,0x10,5);
  auVar2 = vpinsrw_avx(auVar2,0x10,6);
  auVar2 = vpinsrw_avx(auVar2,0x10,7);
  uStack_70 = auVar2._0_8_;
  uStack_68 = auVar2._8_8_;
  auVar4._8_8_ = in_XMM0_Qa;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar4._16_8_ = in_XMM0_Qa;
  auVar4._24_8_ = in_XMM0_Qa;
  auVar3._16_8_ = uStack_70;
  auVar3._0_16_ = auVar1;
  auVar3._24_8_ = uStack_68;
  auVar3 = vpaddw_avx2(auVar4,auVar3);
  auVar3 = vpsraw_avx2(auVar3,ZEXT416(5));
  uStack_d8 = SUB328(ZEXT832(0),4);
  auVar3 = vpshufb_avx2(auVar3,ZEXT832(uStack_d8) << 0x40);
  row_store_32xh((__m256i *)0x0,0,(uint8_t *)0x0,auVar3._24_8_);
  return;
}

Assistant:

void aom_dc_top_predictor_32x64_avx2(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  __m256i sum = dc_sum_32(above);
  (void)left;

  const __m256i sixteen = _mm256_set1_epi16(16);
  sum = _mm256_add_epi16(sum, sixteen);
  sum = _mm256_srai_epi16(sum, 5);
  const __m256i zero = _mm256_setzero_si256();
  __m256i row = _mm256_shuffle_epi8(sum, zero);
  row_store_32xh(&row, 64, dst, stride);
}